

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall bloaty::Bloaty::AddSourceMapFilename(Bloaty *this,string *filename)

{
  long lVar1;
  mapped_type *pmVar2;
  Arg *in_R8;
  string_view format;
  string sourcemap_filename;
  string sourcemap_build_id;
  
  lVar1 = std::__cxx11::string::find((char)filename,0x3d);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&sourcemap_build_id,(ulong)filename);
    std::__cxx11::string::substr((ulong)&sourcemap_filename,(ulong)filename);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->sourcemap_files_,&sourcemap_build_id);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&sourcemap_filename);
    std::__cxx11::string::~string((string *)&sourcemap_build_id);
    return;
  }
  sourcemap_build_id._M_string_length = (size_type)(filename->_M_dataplus)._M_p;
  sourcemap_build_id._M_dataplus._M_p = (pointer)filename->_M_string_length;
  format._M_str = (char *)&sourcemap_build_id;
  format._M_len =
       (size_t)"Source map filename \'$0\' must have a build id and file name separated by \'=\'";
  absl::Substitute_abi_cxx11_(&sourcemap_filename,(absl *)0x4c,format,in_R8);
  Throw(sourcemap_filename._M_dataplus._M_p,0x643);
}

Assistant:

void Bloaty::AddSourceMapFilename(const std::string& filename) {
  std::size_t delimiter = filename.find('=');
  if (delimiter == std::string::npos) {
    THROWF("Source map filename '$0' must have a build id and file name "
           "separated by '='",
           filename);
  }
  std::string sourcemap_build_id = filename.substr(0, delimiter);
  std::string sourcemap_filename = filename.substr(delimiter + 1);
  sourcemap_files_[sourcemap_build_id] = sourcemap_filename;
}